

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall CClient::Update(CClient *this)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  float fVar4;
  int iVar5;
  int64 iVar7;
  int64 iVar8;
  CHolder *pCVar9;
  int64 iVar10;
  int64 iVar11;
  int64 iVar12;
  CHolder *pCVar13;
  bool bVar14;
  undefined1 extraout_var [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM2_Db;
  int iVar6;
  undefined1 auVar17 [16];
  
  iVar1 = (this->super_IClient).m_State;
  if (iVar1 == 4) {
    CDemoPlayer::Update(&this->m_DemoPlayer);
    if ((this->m_DemoPlayer).m_File == (IOHANDLE)0x0) {
      (*(this->super_IClient).super_IInterface._vptr_IInterface[3])(this);
    }
    else {
      iVar1 = (this->m_DemoPlayer).m_Info.m_PreviousTick;
      (this->super_IClient).m_CurGameTick = (this->m_DemoPlayer).m_Info.m_Info.m_CurrentTick;
      (this->super_IClient).m_PrevGameTick = iVar1;
      fVar4 = (this->m_DemoPlayer).m_Info.m_TickTime;
      (this->super_IClient).m_GameIntraTick = (this->m_DemoPlayer).m_Info.m_IntraTick;
      (this->super_IClient).m_GameTickTime = fVar4;
    }
    goto LAB_00121a78;
  }
  if ((iVar1 != 3) || (this->m_ReceivedSnapshots < 3)) goto LAB_00121a78;
  iVar7 = time_freq();
  iVar11 = time_get();
  iVar11 = CSmoothTime::Get(&this->m_GameTime,iVar11);
  iVar12 = time_get();
  iVar12 = CSmoothTime::Get(&this->m_PredictedTime,iVar12);
  iVar1 = this->m_aSnapshots[0]->m_Tick;
  iVar8 = time_freq();
  lVar3 = (iVar8 * iVar1) / 0x32;
  bVar2 = iVar11 <= lVar3;
  if (lVar3 < iVar11) {
    pCVar9 = this->m_aSnapshots[0];
    pCVar13 = pCVar9->m_pNext;
    bVar14 = pCVar13 == (CHolder *)0x0;
    if (!bVar14) {
      do {
        this->m_aSnapshots[1] = pCVar9;
        this->m_aSnapshots[0] = pCVar13;
        (this->super_IClient).m_CurGameTick = pCVar13->m_Tick;
        (this->super_IClient).m_PrevGameTick = pCVar9->m_Tick;
        (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[5])();
        iVar1 = this->m_aSnapshots[0]->m_Tick;
        iVar8 = time_freq();
        if (iVar11 <= (iVar8 * iVar1) / 0x32) goto LAB_00121794;
        pCVar9 = this->m_aSnapshots[0];
        pCVar13 = pCVar9->m_pNext;
      } while (pCVar13 != (CHolder *)0x0);
    }
LAB_00121839:
    bVar2 = bVar14;
    if (this->m_aSnapshots[1] == (CHolder *)0x0) goto LAB_00121a3f;
    iVar1 = pCVar9->m_Tick;
    iVar8 = time_freq();
    iVar5 = this->m_aSnapshots[1]->m_Tick;
    iVar10 = time_freq();
    lVar3 = (iVar10 * iVar5) / 0x32;
    iVar10 = time_freq();
    iVar6 = (int)((iVar12 * 0x32) / iVar10);
    iVar5 = iVar6 + 1;
    auVar15._0_4_ = (float)(iVar11 - lVar3);
    auVar15._4_12_ = extraout_var;
    auVar17._0_8_ = auVar15._0_8_;
    auVar17._8_4_ = extraout_var._0_4_;
    auVar17._12_4_ = extraout_var._0_4_;
    auVar16._8_8_ = auVar17._8_8_;
    auVar16._4_4_ = auVar15._0_4_;
    auVar16._0_4_ = auVar15._0_4_;
    auVar18._4_4_ = (float)iVar7;
    auVar18._0_4_ = (float)((iVar8 * iVar1) / 0x32 - lVar3);
    auVar18._8_4_ = in_XMM1_Db;
    auVar18._12_4_ = in_XMM2_Db;
    auVar18 = divps(auVar16,auVar18);
    (this->super_IClient).m_GameIntraTick = (float)(int)auVar18._0_8_;
    (this->super_IClient).m_GameTickTime = (float)(int)((ulong)auVar18._0_8_ >> 0x20);
    iVar7 = time_freq();
    iVar11 = time_freq();
    lVar3 = (iVar11 * iVar6) / 0x32;
    (this->super_IClient).m_PredIntraTick =
         (float)(iVar12 - lVar3) / (float)((iVar7 * iVar5) / 0x32 - lVar3);
    iVar1 = this->m_aSnapshots[1]->m_Tick;
    if ((iVar5 < iVar1 + -0x32) || (iVar1 + 0x32 <= iVar6)) {
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,1,"client","prediction time reset!",0);
      iVar1 = this->m_aSnapshots[0]->m_Tick;
      iVar7 = time_freq();
      lVar3 = (iVar7 * iVar1) / 0x32;
      iVar7 = time_get();
      (this->m_PredictedTime).m_Snap = iVar7;
      (this->m_PredictedTime).m_Current = lVar3;
      (this->m_PredictedTime).m_Target = lVar3;
      (this->m_PredictedTime).m_aAdjustSpeed[0] = 0.3;
      (this->m_PredictedTime).m_aAdjustSpeed[1] = 0.3;
      (this->m_PredictedTime).m_Graph.m_Min = 0.0;
      (this->m_PredictedTime).m_Graph.m_Max = 0.5;
      (this->m_PredictedTime).m_Graph.m_MinRange = 0.0;
      (this->m_PredictedTime).m_Graph.m_MaxRange = 0.5;
      *(undefined8 *)&(this->m_PredictedTime).m_Graph.m_Index = 0;
      (this->m_PredictedTime).m_BadnessScore = -100;
    }
    if (iVar6 < (this->super_IClient).m_PredTick) goto LAB_00121a3f;
    (this->super_IClient).m_PredTick = iVar5;
    SendInput(this);
  }
  else {
LAB_00121794:
    pCVar9 = this->m_aSnapshots[0];
    bVar14 = bVar2;
    if (pCVar9 != (CHolder *)0x0) goto LAB_00121839;
LAB_00121a3f:
    if (bVar2) goto LAB_00121a78;
  }
  iVar1 = (this->super_IClient).m_CurGameTick;
  iVar5 = (this->super_IClient).m_PredTick;
  if (iVar5 < iVar1 + 0x32 && iVar1 < iVar5) {
    (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0xe])();
  }
LAB_00121a78:
  if (this->m_pConfig->m_DbgStress != 0) {
    iVar11 = time_get();
    iVar7 = Update::ActionTaken;
    iVar1 = (this->super_IClient).m_State;
    iVar12 = time_freq();
    if (iVar1 == 0) {
      if (iVar7 + iVar12 * 2 < iVar11) {
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,2,"stress","reconnecting!",0);
        (*(this->super_IClient).super_IInterface._vptr_IInterface[2])
                  (this,this->m_pConfig->m_DbgStressServer);
        Update::ActionTaken = iVar11;
      }
    }
    else if (iVar12 * ((long)this->m_pConfig->m_DbgStress + 10) + iVar7 < iVar11) {
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,2,"stress","disconnecting!",0);
      (*(this->super_IClient).super_IInterface._vptr_IInterface[3])(this);
      Update::ActionTaken = iVar11;
    }
  }
  PumpNetwork(this);
  (*(this->m_pMasterServer->super_IMasterServer).super_IInterface._vptr_IInterface[7])();
  CServerBrowser::Update(&this->m_ServerBrowser,this->m_ResortServerBrowser);
  this->m_ResortServerBrowser = false;
  if (this->m_EditorActive == false) {
    (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[10])();
    return;
  }
  return;
}

Assistant:

void CClient::Update()
{
	if(State() == IClient::STATE_DEMOPLAYBACK)
	{
		m_DemoPlayer.Update();
		if(m_DemoPlayer.IsPlaying())
		{
			// update timers
			const CDemoPlayer::CPlaybackInfo *pInfo = m_DemoPlayer.Info();
			m_CurGameTick = pInfo->m_Info.m_CurrentTick;
			m_PrevGameTick = pInfo->m_PreviousTick;
			m_GameIntraTick = pInfo->m_IntraTick;
			m_GameTickTime = pInfo->m_TickTime;
		}
		else
		{
			// disconnect on error
			Disconnect();
		}
	}
	else if(State() == IClient::STATE_ONLINE && m_ReceivedSnapshots >= 3)
	{
		// switch snapshot
		int Repredict = 0;
		int64 Freq = time_freq();
		int64 Now = m_GameTime.Get(time_get());
		int64 PredNow = m_PredictedTime.Get(time_get());

		while(1)
		{
			CSnapshotStorage::CHolder *pCur = m_aSnapshots[SNAP_CURRENT];
			int64 TickStart = (pCur->m_Tick)*time_freq()/50;

			if(TickStart < Now)
			{
				CSnapshotStorage::CHolder *pNext = m_aSnapshots[SNAP_CURRENT]->m_pNext;
				if(pNext)
				{
					m_aSnapshots[SNAP_PREV] = m_aSnapshots[SNAP_CURRENT];
					m_aSnapshots[SNAP_CURRENT] = pNext;

					// set ticks
					m_CurGameTick = m_aSnapshots[SNAP_CURRENT]->m_Tick;
					m_PrevGameTick = m_aSnapshots[SNAP_PREV]->m_Tick;

					if(m_aSnapshots[SNAP_CURRENT] && m_aSnapshots[SNAP_PREV])
					{
						GameClient()->OnNewSnapshot();
						Repredict = 1;
					}
				}
				else
					break;
			}
			else
				break;
		}

		if(m_aSnapshots[SNAP_CURRENT] && m_aSnapshots[SNAP_PREV])
		{
			int64 CurtickStart = (m_aSnapshots[SNAP_CURRENT]->m_Tick)*time_freq()/50;
			int64 PrevtickStart = (m_aSnapshots[SNAP_PREV]->m_Tick)*time_freq()/50;
			int PrevPredTick = (int)(PredNow*50/time_freq());
			int NewPredTick = PrevPredTick+1;

			m_GameIntraTick = (Now - PrevtickStart) / (float)(CurtickStart-PrevtickStart);
			m_GameTickTime = (Now - PrevtickStart) / (float)Freq; //(float)SERVER_TICK_SPEED);

			CurtickStart = NewPredTick*time_freq()/50;
			PrevtickStart = PrevPredTick*time_freq()/50;
			m_PredIntraTick = (PredNow - PrevtickStart) / (float)(CurtickStart-PrevtickStart);

			if(NewPredTick < m_aSnapshots[SNAP_PREV]->m_Tick-SERVER_TICK_SPEED || NewPredTick > m_aSnapshots[SNAP_PREV]->m_Tick+SERVER_TICK_SPEED)
			{
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", "prediction time reset!");
				m_PredictedTime.Init(m_aSnapshots[SNAP_CURRENT]->m_Tick*time_freq()/50);
			}

			if(NewPredTick > m_PredTick)
			{
				m_PredTick = NewPredTick;
				Repredict = 1;

				// send input
				SendInput();
			}
		}

		// only do sane predictions
		if(Repredict)
		{
			if(m_PredTick > m_CurGameTick && m_PredTick < m_CurGameTick+50)
				GameClient()->OnPredict();
		}
	}

	// STRESS TEST: join the server again
	if(Config()->m_DbgStress)
	{
		static int64 ActionTaken = 0;
		int64 Now = time_get();
		if(State() == IClient::STATE_OFFLINE)
		{
			if(Now > ActionTaken+time_freq()*2)
			{
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "stress", "reconnecting!");
				Connect(Config()->m_DbgStressServer);
				ActionTaken = Now;
			}
		}
		else
		{
			if(Now > ActionTaken+time_freq()*(10+Config()->m_DbgStress))
			{
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "stress", "disconnecting!");
				Disconnect();
				ActionTaken = Now;
			}
		}
	}

	// pump the network
	PumpNetwork();

	// update the maser server registry
	MasterServer()->Update();

	// update the server browser
	m_ServerBrowser.Update(m_ResortServerBrowser);
	m_ResortServerBrowser = false;

	// update gameclient
	if(!m_EditorActive)
		GameClient()->OnUpdate();
}